

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

char * luaL_tolstring(lua_State *L,int idx,size_t *len)

{
  int iVar1;
  int iVar2;
  int t;
  lua_Integer lVar3;
  void *pvVar4;
  char *pcVar5;
  
  iVar1 = lua_absindex(L,idx);
  iVar2 = luaL_callmeta(L,iVar1,"__tostring");
  if (iVar2 != 0) {
    iVar1 = lua_isstring(L,-1);
    if (iVar1 == 0) {
      luaL_error(L,"\'__tostring\' must return a string");
    }
    goto LAB_0011ace3;
  }
  iVar2 = lua_type(L,iVar1);
  switch(iVar2) {
  case 0:
    pcVar5 = "nil";
    goto LAB_0011ac2c;
  case 1:
    iVar1 = lua_toboolean(L,iVar1);
    pcVar5 = "true";
    if (iVar1 == 0) {
      pcVar5 = "false";
    }
LAB_0011ac2c:
    lua_pushstring(L,pcVar5);
    break;
  default:
    iVar2 = luaL_getmetafield(L,iVar1,"__name");
    if (iVar2 == 4) {
      pcVar5 = lua_tolstring(L,-1,(size_t *)0x0);
    }
    else {
      t = lua_type(L,iVar1);
      pcVar5 = lua_typename(L,t);
    }
    pvVar4 = lua_topointer(L,iVar1);
    lua_pushfstring(L,"%s: %p",pcVar5,pvVar4);
    if (iVar2 != 0) {
      lua_rotate(L,-2,-1);
      lua_settop(L,-2);
    }
    break;
  case 3:
    iVar2 = lua_isinteger(L,iVar1);
    if (iVar2 == 0) {
      lua_tonumberx(L,iVar1,(int *)0x0);
      lua_pushfstring(L,"%f");
    }
    else {
      lVar3 = lua_tointegerx(L,iVar1,(int *)0x0);
      lua_pushfstring(L,"%I",lVar3);
    }
    break;
  case 4:
    lua_pushvalue(L,iVar1);
  }
LAB_0011ace3:
  pcVar5 = lua_tolstring(L,-1,len);
  return pcVar5;
}

Assistant:

LUALIB_API const char *luaL_tolstring (lua_State *L, int idx, size_t *len) {
  idx = lua_absindex(L,idx);
  if (luaL_callmeta(L, idx, "__tostring")) {  /* metafield? */
    if (!lua_isstring(L, -1))
      luaL_error(L, "'__tostring' must return a string");
  }
  else {
    switch (lua_type(L, idx)) {
      case LUA_TNUMBER: {
        if (lua_isinteger(L, idx))
          lua_pushfstring(L, "%I", (LUAI_UACINT)lua_tointeger(L, idx));
        else
          lua_pushfstring(L, "%f", (LUAI_UACNUMBER)lua_tonumber(L, idx));
        break;
      }
      case LUA_TSTRING:
        lua_pushvalue(L, idx);
        break;
      case LUA_TBOOLEAN:
        lua_pushstring(L, (lua_toboolean(L, idx) ? "true" : "false"));
        break;
      case LUA_TNIL:
        lua_pushliteral(L, "nil");
        break;
      default: {
        int tt = luaL_getmetafield(L, idx, "__name");  /* try name */
        const char *kind = (tt == LUA_TSTRING) ? lua_tostring(L, -1) :
                                                 luaL_typename(L, idx);
        lua_pushfstring(L, "%s: %p", kind, lua_topointer(L, idx));
        if (tt != LUA_TNIL)
          lua_remove(L, -2);  /* remove '__name' */
        break;
      }
    }
  }
  return lua_tolstring(L, -1, len);
}